

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.hpp
# Opt level: O2

void __thiscall libtorrent::bitfield::bitfield(bitfield *this,int bits,bool val)

{
  (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false> = (_Head_base<0UL,_unsigned_int_*,_false>)0x0;
  resize(this,bits,val);
  return;
}

Assistant:

bitfield(int bits, bool val) { resize(bits, val); }